

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O3

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
          (DenseStorage<double,__1,__1,__1,_0> *this,Index size,Index rows,Index cols)

{
  double *pdVar1;
  undefined8 *puVar2;
  
  if (this->m_cols * this->m_rows - size != 0) {
    free(this->m_data);
    if (size == 0) {
      pdVar1 = (double *)0x0;
    }
    else {
      if ((ulong)size >> 0x3d != 0) {
LAB_0010cc6e:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = std::ostream::_M_insert<long>;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pdVar1 = (double *)malloc(size * 8);
      if (size != 1 && ((ulong)pdVar1 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/util/Memory.h"
                      ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar1 == (double *)0x0) goto LAB_0010cc6e;
    }
    this->m_data = pdVar1;
  }
  this->m_rows = rows;
  this->m_cols = cols;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC void resize(Index size, Index rows, Index cols)
    {
      if(size != m_rows*m_cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, m_rows*m_cols);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
      m_cols = cols;
    }